

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5WriteDlidxGrow(Fts5Index *p,Fts5SegWriter *pWriter,int nLvl)

{
  void *pvVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  size_t nByte;
  Fts5DlidxWriter *aDlidx;
  void *in_stack_ffffffffffffffd8;
  
  if ((*(int *)(in_RDI + 0x3c) == 0) && (*(int *)(in_RSI + 0x54) <= in_EDX)) {
    pvVar1 = sqlite3_realloc64(in_stack_ffffffffffffffd8,0x279fea);
    if (pvVar1 == (void *)0x0) {
      *(undefined4 *)(in_RDI + 0x3c) = 7;
    }
    else {
      memset((void *)((long)pvVar1 + (long)*(int *)(in_RSI + 0x54) * 0x20),0,
             (long)(in_EDX - *(int *)(in_RSI + 0x54)) << 5);
      *(void **)(in_RSI + 0x58) = pvVar1;
      *(int *)(in_RSI + 0x54) = in_EDX;
    }
  }
  return *(int *)(in_RDI + 0x3c);
}

Assistant:

static int fts5WriteDlidxGrow(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int nLvl
){
  if( p->rc==SQLITE_OK && nLvl>=pWriter->nDlidx ){
    Fts5DlidxWriter *aDlidx = (Fts5DlidxWriter*)sqlite3_realloc64(
        pWriter->aDlidx, sizeof(Fts5DlidxWriter) * nLvl
    );
    if( aDlidx==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      size_t nByte = sizeof(Fts5DlidxWriter) * (nLvl - pWriter->nDlidx);
      memset(&aDlidx[pWriter->nDlidx], 0, nByte);
      pWriter->aDlidx = aDlidx;
      pWriter->nDlidx = nLvl;
    }
  }
  return p->rc;
}